

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

curl_slist * Curl_cookie_list(Curl_easy *data)

{
  CookieInfo *pCVar1;
  char *data_00;
  curl_slist *pcVar2;
  Cookie *co;
  curl_slist *list;
  
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  pCVar1 = data->cookies;
  if (((pCVar1 == (CookieInfo *)0x0) || (pCVar1->numcookies == 0)) ||
     (co = pCVar1->cookies, co == (Cookie *)0x0)) {
LAB_0010ee28:
    pcVar2 = (curl_slist *)0x0;
  }
  else {
    list = (curl_slist *)0x0;
    do {
      pcVar2 = list;
      if (co->domain != (char *)0x0) {
        data_00 = get_netscape_format(co);
        if (data_00 != (char *)0x0) {
          pcVar2 = Curl_slist_append_nodup(list,data_00);
          if (pcVar2 != (curl_slist *)0x0) goto LAB_0010ee07;
          (*Curl_cfree)(data_00);
        }
        curl_slist_free_all(list);
        goto LAB_0010ee28;
      }
LAB_0010ee07:
      co = co->next;
      list = pcVar2;
    } while (co != (Cookie *)0x0);
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return pcVar2;
}

Assistant:

struct curl_slist *Curl_cookie_list(struct Curl_easy *data)
{
  struct curl_slist *list;
  Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  list = cookie_list(data);
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
  return list;
}